

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_image * nifti_image_from_ascii(char *str,int *bytes_read)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float dx;
  float dy;
  float dz;
  mat44 R;
  mat44 R_00;
  int iVar5;
  int iVar6;
  nifti_image *pnVar7;
  ushort **ppuVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  float qc;
  float qd;
  float qx;
  float qy;
  float qz;
  float qfac;
  nifti_image *pnVar23;
  nifti_image *pnVar24;
  undefined4 in_stack_fffffffffffff668;
  uint in_stack_fffffffffffff66c;
  undefined4 in_stack_fffffffffffff678;
  int in_stack_fffffffffffff67c;
  mat44 *pmVar25;
  uint val;
  float fStack_874;
  float afStack_870 [2];
  float local_868 [2];
  float afStack_860 [2];
  float local_858 [2];
  float afStack_850 [2];
  float local_848 [2];
  float afStack_840 [2];
  char rhs [1024];
  char lhs [1024];
  
  if ((str != (char *)0x0) && (*str != '\0')) {
    iVar5 = __isoc99_sscanf(str,"%1023s%n",lhs,&stack0xfffffffffffff66c);
    if (iVar5 == 0) {
      return (nifti_image *)0x0;
    }
    uVar19 = in_stack_fffffffffffff66c;
    iVar5 = bcmp(lhs,"<nifti_image",0xd);
    if (iVar5 == 0) {
      pnVar7 = (nifti_image *)calloc(1,0x2b8);
      if (pnVar7 != (nifti_image *)0x0) {
        pnVar7->nw = 1;
        pnVar7->nu = 1;
        pnVar7->nv = 1;
        pnVar7->nx = 1;
        pnVar7->ny = 1;
        pnVar7->nz = 1;
        pnVar7->nt = 1;
        pnVar7->dx = 0.0;
        pnVar7->dy = 0.0;
        pnVar7->dz = 0.0;
        pnVar7->dt = 0.0;
        pnVar7->dt = 0.0;
        pnVar7->du = 0.0;
        pnVar7->dv = 0.0;
        pnVar7->dw = 0.0;
        pnVar7->qfac = 1.0;
        pnVar7->byteorder = 1;
        ppuVar8 = __ctype_b_loc();
        pmVar25 = &pnVar7->sto_xyz;
        pnVar23 = pnVar7;
        while( true ) {
          uVar14 = (ulong)(in_stack_fffffffffffff66c - 1);
          pcVar17 = str + (long)(int)in_stack_fffffffffffff66c + -1;
          uVar10 = in_stack_fffffffffffff66c;
          do {
            uVar18 = uVar10;
            in_stack_fffffffffffff66c = in_stack_fffffffffffff66c + 1;
            pcVar16 = pcVar17 + 1;
            pcVar17 = pcVar17 + 1;
            uVar11 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar11;
            uVar10 = uVar18 + 1;
          } while ((*(byte *)((long)*ppuVar8 + (long)*pcVar16 * 2 + 1) & 0x20) != 0);
          uVar10 = uVar19;
          if (*pcVar16 == '\0') goto LAB_0010d152;
          iVar5 = __isoc99_sscanf(pcVar17,"%1023s%n",lhs,&stack0xfffffffffffff66c);
          uVar10 = uVar19;
          if ((iVar5 == 0) || (iVar5 = bcmp(lhs,"/>",3), iVar5 == 0)) break;
          lVar12 = (long)(int)(uVar18 + uVar19);
          pcVar17 = str + lVar12 + 1;
          uVar14 = lVar12 - 1;
          uVar19 = in_stack_fffffffffffff66c + uVar19;
          do {
            do {
              uVar11 = uVar19;
              uVar13 = uVar14;
              pcVar16 = pcVar17;
              cVar1 = str[uVar13 + 1];
              uVar14 = uVar13 + 1;
              uVar19 = uVar11 + 1;
              pcVar17 = pcVar16 + 1;
            } while ((long)cVar1 == 0x3d);
          } while (((*ppuVar8)[cVar1] & 0x2000) != 0);
          if (cVar1 == '\'') {
            uVar19 = 0xffffffff;
            do {
              in_stack_fffffffffffff66c = uVar11;
              cVar1 = *pcVar16;
              uVar11 = in_stack_fffffffffffff66c + 1;
              uVar19 = uVar19 + 1;
              if (cVar1 == '\'') break;
              pcVar16 = pcVar16 + 1;
            } while (cVar1 != '\0');
            if (0x3fe < (int)uVar19) {
              uVar19 = 0x3ff;
            }
            sVar9 = (size_t)(int)uVar19;
            memcpy(rhs,str + uVar13 + 2,sVar9);
            rhs[sVar9] = '\0';
            pnVar24 = pnVar23;
            if (cVar1 == '\'') {
              in_stack_fffffffffffff66c = uVar11;
            }
          }
          else {
            if (cVar1 == '\0') goto LAB_0010d152;
            iVar5 = __isoc99_sscanf(str + uVar14,"%1023s%n",rhs,&stack0xfffffffffffff66c);
            in_stack_fffffffffffff66c = uVar10 + (int)uVar14;
            pnVar24 = pnVar23;
            uVar19 = uVar10;
            if (iVar5 == 0) {
              uVar14 = (ulong)in_stack_fffffffffffff66c;
LAB_0010d152:
              if (bytes_read != (int *)0x0) {
                *bytes_read = (int)uVar14 + 1;
              }
              if ((0 < pnVar23->ndim) &&
                 (pnVar24 = pnVar23,
                 nifti_datatype_sizes(pnVar23->datatype,&pnVar7->nbyper,&pnVar7->swapsize),
                 pnVar23->nbyper != 0)) {
                pnVar23->dim[0] = pnVar23->ndim;
                iVar5 = pnVar23->nx;
                pnVar23->dim[1] = iVar5;
                iVar6 = pnVar23->ny;
                pnVar23->dim[2] = iVar6;
                iVar15 = pnVar23->nz;
                pnVar23->dim[3] = iVar15;
                iVar2 = pnVar23->nt;
                pnVar23->dim[4] = iVar2;
                dx = pnVar23->dx;
                dy = pnVar23->dy;
                dz = pnVar23->dz;
                fVar20 = pnVar23->dt;
                pnVar23->pixdim[1] = dx;
                pnVar23->pixdim[2] = dy;
                pnVar23->pixdim[3] = dz;
                pnVar23->pixdim[4] = fVar20;
                iVar3 = pnVar23->nu;
                pnVar23->dim[5] = iVar3;
                iVar4 = pnVar23->nv;
                pnVar23->dim[6] = iVar4;
                fVar20 = pnVar23->dv;
                pnVar23->pixdim[5] = pnVar23->du;
                pnVar23->pixdim[6] = fVar20;
                pnVar23->dim[7] = pnVar23->nw;
                pnVar23->pixdim[7] = pnVar23->dw;
                pnVar23->nvox =
                     (long)iVar3 * (long)iVar4 * (long)pnVar23->nw *
                     (long)iVar15 * (long)iVar2 * (long)iVar6 * (long)iVar5;
                if (pnVar23->qform_code < 1) {
                  qfac = 0.0;
                  fVar20 = 0.0;
                  qc = 0.0;
                  qd = 0.0;
                  qx = 0.0;
                  qy = 0.0;
                  qz = 0.0;
                }
                else {
                  fVar20 = pnVar23->quatern_b;
                  qc = pnVar23->quatern_c;
                  qd = pnVar23->quatern_d;
                  qx = pnVar23->qoffset_x;
                  qy = pnVar23->qoffset_y;
                  qz = pnVar23->qoffset_z;
                  qfac = pnVar23->qfac;
                }
                nifti_quatern_to_mat44((mat44 *)&val,fVar20,qc,qd,qx,qy,qz,dx,dy,dz,qfac);
                *(float (*) [2])(pnVar7->qto_xyz).m[3] = local_848;
                *(float (*) [2])((pnVar7->qto_xyz).m[3] + 2) = afStack_840;
                *(float (*) [2])(pnVar7->qto_xyz).m[2] = local_858;
                *(float (*) [2])((pnVar7->qto_xyz).m[2] + 2) = afStack_850;
                *(float (*) [2])(pnVar7->qto_xyz).m[1] = local_868;
                *(float (*) [2])((pnVar7->qto_xyz).m[1] + 2) = afStack_860;
                *(ulong *)(pnVar7->qto_xyz).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((pnVar7->qto_xyz).m[0] + 2) = afStack_870;
                R.m[0][2] = (float)in_stack_fffffffffffff668;
                R.m[0]._0_8_ = pnVar24;
                R.m[0][3] = (float)uVar10;
                R.m[1]._0_8_ = ppuVar8;
                R.m[1][2] = (float)in_stack_fffffffffffff678;
                R.m[1][3] = (float)in_stack_fffffffffffff67c;
                R.m[2]._0_8_ = pmVar25;
                R.m[2]._8_8_ = *(undefined8 *)(pnVar23->qto_xyz).m[0];
                R.m[3]._0_8_ = *(undefined8 *)((pnVar23->qto_xyz).m[0] + 2);
                R.m[3]._8_8_ = *(undefined8 *)(pnVar23->qto_xyz).m[1];
                nifti_mat44_inverse(R);
                *(float (*) [2])(pnVar23->qto_ijk).m[3] = local_848;
                *(float (*) [2])((pnVar23->qto_ijk).m[3] + 2) = afStack_840;
                *(float (*) [2])(pnVar23->qto_ijk).m[2] = local_858;
                *(float (*) [2])((pnVar23->qto_ijk).m[2] + 2) = afStack_850;
                *(float (*) [2])(pnVar23->qto_ijk).m[1] = local_868;
                *(float (*) [2])((pnVar23->qto_ijk).m[1] + 2) = afStack_860;
                *(ulong *)(pnVar23->qto_ijk).m[0] = CONCAT44(fStack_874,val);
                *(float (*) [2])((pnVar23->qto_ijk).m[0] + 2) = afStack_870;
                if (0 < pnVar23->sform_code) {
                  R_00.m[0][2] = (float)in_stack_fffffffffffff668;
                  R_00.m[0]._0_8_ = pnVar24;
                  R_00.m[0][3] = (float)uVar10;
                  R_00.m[1]._0_8_ = ppuVar8;
                  R_00.m[1][2] = (float)in_stack_fffffffffffff678;
                  R_00.m[1][3] = (float)in_stack_fffffffffffff67c;
                  R_00.m[2]._0_8_ = pmVar25;
                  R_00.m[2]._8_8_ = *(undefined8 *)pmVar25->m[0];
                  R_00.m[3]._0_8_ = *(undefined8 *)(pmVar25->m[0] + 2);
                  R_00.m[3]._8_8_ = *(undefined8 *)pmVar25->m[1];
                  nifti_mat44_inverse(R_00);
                  *(float (*) [2])(pnVar23->sto_ijk).m[3] = local_848;
                  *(float (*) [2])((pnVar23->sto_ijk).m[3] + 2) = afStack_840;
                  *(float (*) [2])(pnVar23->sto_ijk).m[2] = local_858;
                  *(float (*) [2])((pnVar23->sto_ijk).m[2] + 2) = afStack_850;
                  *(float (*) [2])(pnVar23->sto_ijk).m[1] = local_868;
                  *(float (*) [2])((pnVar23->sto_ijk).m[1] + 2) = afStack_860;
                  *(ulong *)(pnVar23->sto_ijk).m[0] = CONCAT44(fStack_874,val);
                  *(float (*) [2])((pnVar23->sto_ijk).m[0] + 2) = afStack_870;
                  return pnVar23;
                }
                return pnVar23;
              }
              nifti_image_free(pnVar23);
              return (nifti_image *)0x0;
            }
          }
          sVar9 = strlen(rhs);
          iVar5 = (int)sVar9;
          if (iVar5 != 0) {
            in_stack_fffffffffffff67c = iVar5 + -4;
            uVar14 = 0;
            iVar6 = 0;
            while (iVar6 < iVar5) {
              lVar12 = (long)iVar6;
              cVar1 = rhs[lVar12];
              iVar15 = iVar6;
              if (cVar1 == '\r') {
                cVar1 = rhs[lVar12 + 1];
                rhs[uVar14] = '\n';
                if (cVar1 == '\n') {
                  iVar15 = iVar6 + 1;
                }
              }
              else if (cVar1 == '&') {
                iVar2 = iVar6 + 3;
                if (iVar2 < iVar5) {
                  iVar15 = iVar2;
                  if (rhs[lVar12 + 1] == 'g') {
                    if ((rhs[lVar12 + 2] != 't') || (rhs[iVar2] != ';')) goto LAB_0010c0d1;
                    rhs[uVar14] = '>';
                  }
                  else {
                    if (((rhs[lVar12 + 1] != 'l') || (rhs[lVar12 + 2] != 't')) ||
                       (rhs[iVar2] != ';')) goto LAB_0010c0d1;
                    rhs[uVar14] = '<';
                  }
                }
                else {
LAB_0010c0d1:
                  iVar15 = iVar6 + 5;
                  if (iVar15 < iVar5) {
                    if (rhs[lVar12 + 1] == 'a') {
                      if (((rhs[lVar12 + 2] != 'p') || (rhs[iVar2] != 'o')) ||
                         ((rhs[lVar12 + 4] != 's' || (rhs[lVar12 + 5] != ';')))) goto LAB_0010c146;
                      rhs[uVar14] = '\'';
                    }
                    else {
                      if (((rhs[lVar12 + 1] != 'q') || (rhs[lVar12 + 2] != 'u')) ||
                         ((rhs[iVar2] != 'o' ||
                          ((rhs[lVar12 + 4] != 't' || (rhs[lVar12 + 5] != ';'))))))
                      goto LAB_0010c146;
                      rhs[uVar14] = '\"';
                    }
                  }
                  else {
LAB_0010c146:
                    iVar15 = iVar6 + 4;
                    if ((iVar15 < iVar5) &&
                       ((((rhs[lVar12 + 1] == 'a' && (rhs[lVar12 + 2] == 'm')) &&
                         (rhs[iVar2] == 'p')) && (rhs[iVar15] == ';')))) {
                      rhs[uVar14] = '&';
                    }
                    else {
                      if (((iVar2 < iVar5) && (rhs[lVar12 + 1] == '#')) &&
                         ((*(byte *)((long)*ppuVar8 + (long)rhs[lVar12 + 2] * 2 + 1) & 8) != 0)) {
                        pcVar17 = rhs + 2;
                        uVar11 = (iVar5 + -3) - iVar6;
                        uVar10 = 0x38U - iVar6;
                        if (uVar11 < 0x38U - iVar6) {
                          uVar10 = uVar11;
                        }
                        iVar15 = iVar2 + uVar10;
                        pcVar16 = "%u";
                      }
                      else {
                        if (((iVar5 <= iVar15) || (rhs[lVar12 + 1] != '#')) ||
                           ((rhs[lVar12 + 2] != 'x' ||
                            ((*(byte *)((long)*ppuVar8 + (long)rhs[iVar2] * 2 + 1) & 0x10) == 0))))
                        {
                          iVar15 = iVar6;
                          if ((long)uVar14 < lVar12) {
                            rhs[uVar14] = '&';
                          }
                          goto LAB_0010c1d9;
                        }
                        uVar10 = 0x37U - iVar6;
                        if ((uint)(in_stack_fffffffffffff67c - iVar6) < 0x37U - iVar6) {
                          uVar10 = in_stack_fffffffffffff67c - iVar6;
                        }
                        iVar15 = uVar10 + iVar15;
                        pcVar17 = rhs + 3;
                        pcVar16 = "%x";
                      }
                      val = 0x3f;
                      __isoc99_sscanf(pcVar17 + lVar12,pcVar16,&val);
                      rhs[uVar14] = (char)val;
                    }
                  }
                }
              }
              else if ((long)uVar14 < lVar12) {
                rhs[uVar14] = cVar1;
              }
LAB_0010c1d9:
              uVar14 = uVar14 + 1;
              iVar6 = iVar15 + 1;
            }
            if ((int)uVar14 < iVar5) {
              rhs[uVar14 & 0xffffffff] = '\0';
            }
          }
          iVar5 = bcmp(lhs,"nifti_type",0xb);
          if (iVar5 == 0) {
            iVar5 = bcmp(rhs,"ANALYZE-7.5",0xc);
            pnVar23 = pnVar24;
            if (iVar5 == 0) {
              pnVar24->nifti_type = 0;
            }
            else {
              iVar5 = bcmp(rhs,"NIFTI-1+",9);
              if (iVar5 == 0) {
                pnVar24->nifti_type = 1;
              }
              else if (rhs._0_8_ == 0x312d495446494e) {
                pnVar24->nifti_type = 2;
              }
              else {
                iVar5 = bcmp(rhs,"NIFTI-1A",9);
                if (iVar5 == 0) {
                  pnVar24->nifti_type = 3;
                }
              }
            }
          }
          else {
            auVar22[0] = -(lhs[0] == 'h');
            auVar22[1] = -(lhs[1] == 'e');
            auVar22[2] = -(lhs[2] == 'a');
            auVar22[3] = -(lhs[3] == 'd');
            auVar22[4] = -(lhs[4] == 'e');
            auVar22[5] = -(lhs[5] == 'r');
            auVar22[6] = -(lhs[6] == '_');
            auVar22[7] = -(lhs[7] == 'f');
            auVar22[8] = -(lhs[8] == 'i');
            auVar22[9] = -(lhs[9] == 'l');
            auVar22[10] = -(lhs[10] == 'e');
            auVar22[0xb] = -(lhs[0xb] == 'n');
            auVar22[0xc] = -(lhs[0xc] == 'a');
            auVar22[0xd] = -(lhs[0xd] == 'm');
            auVar22[0xe] = -(lhs[0xe] == 'e');
            auVar22[0xf] = -(lhs[0xf] == '\0');
            pnVar23 = pnVar24;
            if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
              pcVar17 = nifti_strdup(rhs);
              pnVar24->fname = pcVar17;
            }
            else {
              iVar5 = bcmp(lhs,"image_filename",0xf);
              if (iVar5 == 0) {
                pcVar17 = nifti_strdup(rhs);
                pnVar24->iname = pcVar17;
              }
              else {
                iVar5 = bcmp(lhs,"sto_xyz_matrix",0xf);
                if (iVar5 == 0) {
                  __isoc99_sscanf(rhs,"%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f",pmVar25,
                                  (pnVar7->sto_xyz).m[0] + 1,(pnVar7->sto_xyz).m[0] + 2,
                                  (pnVar7->sto_xyz).m[0] + 3,(pnVar7->sto_xyz).m + 1,
                                  (pnVar7->sto_xyz).m[1] + 1,(pnVar7->sto_xyz).m[1] + 2,
                                  (pnVar7->sto_xyz).m[1] + 3,(pnVar7->sto_xyz).m + 2,
                                  (pnVar7->sto_xyz).m[2] + 1,(pnVar7->sto_xyz).m[2] + 2,
                                  (pnVar7->sto_xyz).m[2] + 3,(pnVar7->sto_xyz).m + 3,
                                  (pnVar7->sto_xyz).m[3] + 1,(pnVar7->sto_xyz).m[3] + 2,
                                  (pnVar7->sto_xyz).m[3] + 3);
                }
                else {
                  iVar5 = bcmp(lhs,"byteorder",10);
                  if (iVar5 == 0) {
                    iVar5 = bcmp(rhs,"MSB_FIRST",10);
                    if (iVar5 == 0) {
                      pnVar24->byteorder = 2;
                    }
                    iVar5 = bcmp(rhs,"LSB_FIRST",10);
                    if (iVar5 == 0) {
                      pnVar24->byteorder = 1;
                    }
                  }
                  else {
                    iVar5 = bcmp(lhs,"image_offset",0xd);
                    if (iVar5 == 0) {
                      dVar21 = strtod(rhs,(char **)0x0);
                      pnVar24->iname_offset = (int)dVar21;
                    }
                    else {
                      iVar5 = bcmp(lhs,"datatype",9);
                      if (iVar5 == 0) {
                        dVar21 = strtod(rhs,(char **)0x0);
                        pnVar24->datatype = (int)(short)(int)dVar21;
                      }
                      else {
                        iVar5 = bcmp(lhs,"ndim",5);
                        if (iVar5 == 0) {
                          dVar21 = strtod(rhs,(char **)0x0);
                          pnVar24->ndim = (int)dVar21;
                        }
                        else {
                          iVar5 = bcmp(lhs,"nx",3);
                          if (iVar5 == 0) {
                            dVar21 = strtod(rhs,(char **)0x0);
                            pnVar24->nx = (int)dVar21;
                          }
                          else {
                            iVar5 = bcmp(lhs,"ny",3);
                            if (iVar5 == 0) {
                              dVar21 = strtod(rhs,(char **)0x0);
                              pnVar24->ny = (int)dVar21;
                            }
                            else {
                              iVar5 = bcmp(lhs,"nz",3);
                              if (iVar5 == 0) {
                                dVar21 = strtod(rhs,(char **)0x0);
                                pnVar24->nz = (int)dVar21;
                              }
                              else {
                                iVar5 = bcmp(lhs,"nt",3);
                                if (iVar5 == 0) {
                                  dVar21 = strtod(rhs,(char **)0x0);
                                  pnVar24->nt = (int)dVar21;
                                }
                                else {
                                  iVar5 = bcmp(lhs,"nu",3);
                                  if (iVar5 == 0) {
                                    dVar21 = strtod(rhs,(char **)0x0);
                                    pnVar24->nu = (int)dVar21;
                                  }
                                  else {
                                    iVar5 = bcmp(lhs,"nv",3);
                                    if (iVar5 == 0) {
                                      dVar21 = strtod(rhs,(char **)0x0);
                                      pnVar24->nv = (int)dVar21;
                                    }
                                    else {
                                      iVar5 = bcmp(lhs,"nw",3);
                                      if (iVar5 == 0) {
                                        dVar21 = strtod(rhs,(char **)0x0);
                                        pnVar24->nw = (int)dVar21;
                                      }
                                      else {
                                        iVar5 = bcmp(lhs,"dx",3);
                                        if (iVar5 == 0) {
                                          dVar21 = strtod(rhs,(char **)0x0);
                                          pnVar7->dx = (float)dVar21;
                                        }
                                        else {
                                          iVar5 = bcmp(lhs,"dy",3);
                                          if (iVar5 == 0) {
                                            dVar21 = strtod(rhs,(char **)0x0);
                                            pnVar24->dy = (float)dVar21;
                                          }
                                          else {
                                            iVar5 = bcmp(lhs,"dz",3);
                                            if (iVar5 == 0) {
                                              dVar21 = strtod(rhs,(char **)0x0);
                                              pnVar24->dz = (float)dVar21;
                                            }
                                            else {
                                              iVar5 = bcmp(lhs,"dt",3);
                                              if (iVar5 == 0) {
                                                dVar21 = strtod(rhs,(char **)0x0);
                                                pnVar24->dt = (float)dVar21;
                                              }
                                              else {
                                                iVar5 = bcmp(lhs,"du",3);
                                                if (iVar5 == 0) {
                                                  dVar21 = strtod(rhs,(char **)0x0);
                                                  pnVar23->du = (float)dVar21;
                                                }
                                                else {
                                                  iVar5 = bcmp(lhs,"dv",3);
                                                  if (iVar5 == 0) {
                                                    dVar21 = strtod(rhs,(char **)0x0);
                                                    pnVar23->dv = (float)dVar21;
                                                  }
                                                  else {
                                                    iVar5 = bcmp(lhs,"dw",3);
                                                    if (iVar5 == 0) {
                                                      dVar21 = strtod(rhs,(char **)0x0);
                                                      pnVar23->dw = (float)dVar21;
                                                    }
                                                    else {
                                                      lVar12 = CONCAT17(lhs[7],CONCAT16(lhs[6],
                                                  CONCAT15(lhs[5],CONCAT14(lhs[4],CONCAT13(lhs[3],
                                                  CONCAT12(lhs[2],CONCAT11(lhs[1],lhs[0])))))));
                                                  if (lVar12 == 0x78616d5f6c6163) {
                                                    dVar21 = strtod(rhs,(char **)0x0);
                                                    pnVar23->cal_max = (float)dVar21;
                                                  }
                                                  else if (lVar12 == 0x6e696d5f6c6163) {
                                                    dVar21 = strtod(rhs,(char **)0x0);
                                                    pnVar23->cal_min = (float)dVar21;
                                                  }
                                                  else {
                                                    iVar5 = bcmp(lhs,"scl_slope",10);
                                                    if (iVar5 == 0) {
                                                      dVar21 = strtod(rhs,(char **)0x0);
                                                      pnVar23->scl_slope = (float)dVar21;
                                                    }
                                                    else {
                                                      iVar5 = bcmp(lhs,"scl_inter",10);
                                                      if (iVar5 == 0) {
                                                        dVar21 = strtod(rhs,(char **)0x0);
                                                        pnVar23->scl_inter = (float)dVar21;
                                                      }
                                                      else {
                                                        iVar5 = bcmp(lhs,"intent_code",0xc);
                                                        if (iVar5 == 0) {
                                                          dVar21 = strtod(rhs,(char **)0x0);
                                                          pnVar23->intent_code =
                                                               (int)(short)(int)dVar21;
                                                        }
                                                        else {
                                                          iVar5 = bcmp(lhs,"intent_p1",10);
                                                          if (iVar5 == 0) {
                                                            dVar21 = strtod(rhs,(char **)0x0);
                                                            pnVar23->intent_p1 = (float)dVar21;
                                                          }
                                                          else {
                                                            iVar5 = bcmp(lhs,"intent_p2",10);
                                                            if (iVar5 == 0) {
                                                              dVar21 = strtod(rhs,(char **)0x0);
                                                              pnVar23->intent_p2 = (float)dVar21;
                                                            }
                                                            else {
                                                              iVar5 = bcmp(lhs,"intent_p3",10);
                                                              if (iVar5 == 0) {
                                                                dVar21 = strtod(rhs,(char **)0x0);
                                                                pnVar23->intent_p3 = (float)dVar21;
                                                              }
                                                              else {
                                                                iVar5 = bcmp(lhs,"intent_name",0xc);
                                                                if (iVar5 == 0) {
                                                                  strncpy(pnVar7->intent_name,rhs,
                                                                          0xf);
                                                                  pnVar23->intent_name[0xf] = '\0';
                                                                }
                                                                else if (lVar12 == 0x74657366666f74)
                                                                {
                                                                  dVar21 = strtod(rhs,(char **)0x0);
                                                                  pnVar23->toffset = (float)dVar21;
                                                                }
                                                                else {
                                                                  iVar5 = bcmp(lhs,"xyz_units",10);
                                                                  if (iVar5 == 0) {
                                                                    dVar21 = strtod(rhs,(char **)0x0
                                                                                   );
                                                                    pnVar23->xyz_units = (int)dVar21
                                                                    ;
                                                                  }
                                                                  else {
                                                                    iVar5 = bcmp(lhs,"time_units",
                                                                                 0xb);
                                                                    if (iVar5 == 0) {
                                                                      dVar21 = strtod(rhs,(char **)
                                                  0x0);
                                                  pnVar23->time_units = (int)dVar21;
                                                  }
                                                  else if (lVar12 == 0x70697263736564) {
                                                    strncpy(pnVar7->descrip,rhs,0x4f);
                                                    pnVar23->descrip[0x4f] = '\0';
                                                  }
                                                  else {
                                                    iVar5 = bcmp(lhs,"aux_file",9);
                                                    if (iVar5 == 0) {
                                                      strncpy(pnVar7->aux_file,rhs,0x17);
                                                      pnVar23->aux_file[0x17] = '\0';
                                                    }
                                                    else {
                                                      iVar5 = bcmp(lhs,"qform_code",0xb);
                                                      if (iVar5 == 0) {
                                                        dVar21 = strtod(rhs,(char **)0x0);
                                                        pnVar23->qform_code = (int)dVar21;
                                                      }
                                                      else {
                                                        iVar5 = bcmp(lhs,"quatern_b",10);
                                                        if (iVar5 == 0) {
                                                          dVar21 = strtod(rhs,(char **)0x0);
                                                          pnVar23->quatern_b = (float)dVar21;
                                                        }
                                                        else {
                                                          iVar5 = bcmp(lhs,"quatern_c",10);
                                                          if (iVar5 == 0) {
                                                            dVar21 = strtod(rhs,(char **)0x0);
                                                            pnVar23->quatern_c = (float)dVar21;
                                                          }
                                                          else {
                                                            iVar5 = bcmp(lhs,"quatern_d",10);
                                                            if (iVar5 == 0) {
                                                              dVar21 = strtod(rhs,(char **)0x0);
                                                              pnVar23->quatern_d = (float)dVar21;
                                                            }
                                                            else {
                                                              iVar5 = bcmp(lhs,"qoffset_x",10);
                                                              if (iVar5 == 0) {
                                                                dVar21 = strtod(rhs,(char **)0x0);
                                                                pnVar23->qoffset_x = (float)dVar21;
                                                              }
                                                              else {
                                                                iVar5 = bcmp(lhs,"qoffset_y",10);
                                                                if (iVar5 == 0) {
                                                                  dVar21 = strtod(rhs,(char **)0x0);
                                                                  pnVar23->qoffset_y = (float)dVar21
                                                                  ;
                                                                }
                                                                else {
                                                                  iVar5 = bcmp(lhs,"qoffset_z",10);
                                                                  if (iVar5 == 0) {
                                                                    dVar21 = strtod(rhs,(char **)0x0
                                                                                   );
                                                                    pnVar23->qoffset_z =
                                                                         (float)dVar21;
                                                                  }
                                                                  else {
                                                                    iVar5 = bcmp(lhs,"qfac",5);
                                                                    if (iVar5 == 0) {
                                                                      dVar21 = strtod(rhs,(char **)
                                                  0x0);
                                                  pnVar23->qfac = (float)dVar21;
                                                  }
                                                  else {
                                                    iVar5 = bcmp(lhs,"sform_code",0xb);
                                                    if (iVar5 == 0) {
                                                      dVar21 = strtod(rhs,(char **)0x0);
                                                      pnVar23->sform_code = (int)dVar21;
                                                    }
                                                    else {
                                                      iVar5 = bcmp(lhs,"freq_dim",9);
                                                      if (iVar5 == 0) {
                                                        dVar21 = strtod(rhs,(char **)0x0);
                                                        pnVar23->freq_dim = (int)dVar21;
                                                      }
                                                      else {
                                                        iVar5 = bcmp(lhs,"phase_dim",10);
                                                        if (iVar5 == 0) {
                                                          dVar21 = strtod(rhs,(char **)0x0);
                                                          pnVar23->phase_dim = (int)dVar21;
                                                        }
                                                        else {
                                                          iVar5 = bcmp(lhs,"slice_dim",10);
                                                          if (iVar5 == 0) {
                                                            dVar21 = strtod(rhs,(char **)0x0);
                                                            pnVar23->slice_dim = (int)dVar21;
                                                          }
                                                          else {
                                                            iVar5 = bcmp(lhs,"slice_code",0xb);
                                                            if (iVar5 == 0) {
                                                              dVar21 = strtod(rhs,(char **)0x0);
                                                              pnVar23->slice_code = (int)dVar21;
                                                            }
                                                            else {
                                                              iVar5 = bcmp(lhs,"slice_start",0xc);
                                                              if (iVar5 == 0) {
                                                                dVar21 = strtod(rhs,(char **)0x0);
                                                                pnVar23->slice_start = (int)dVar21;
                                                              }
                                                              else {
                                                                iVar5 = bcmp(lhs,"slice_end",10);
                                                                if (iVar5 == 0) {
                                                                  dVar21 = strtod(rhs,(char **)0x0);
                                                                  pnVar23->slice_end = (int)dVar21;
                                                                }
                                                                else {
                                                                  iVar5 = bcmp(lhs,"slice_duration",
                                                                               0xf);
                                                                  if (iVar5 == 0) {
                                                                    dVar21 = strtod(rhs,(char **)0x0
                                                                                   );
                                                                    pnVar23->slice_duration =
                                                                         (float)dVar21;
                                                                  }
                                                                  else if (lVar12 == 
                                                  0x7478655f6d756e) {
                                                    pnVar24 = pnVar23;
                                                    dVar21 = strtod(rhs,(char **)0x0);
                                                    pnVar23->num_ext = (int)dVar21;
                                                    pnVar23 = pnVar24;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        uVar14 = (ulong)(uVar19 + uVar11);
        goto LAB_0010d152;
      }
      fwrite("** NIFA: failed to alloc nifti_image\n",0x25,1,_stderr);
    }
  }
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_from_ascii( const char *str, int * bytes_read )
{
   char lhs[1024] , rhs[1024] ;
   int ii , spos, nn ;
   nifti_image *nim ;              /* will be output */

   if( str == NULL || *str == '\0' ) return NULL ;  /* bad input!? */

   /* scan for opening string */

   spos = 0 ; 
   ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
   if( ii == 0 || strcmp(lhs,"<nifti_image") != 0 ) return NULL ;

   /* create empty image struct */

   nim = (nifti_image *)calloc( 1 , sizeof(nifti_image) ) ;
   if( !nim ){
      fprintf(stderr,"** NIFA: failed to alloc nifti_image\n");
      return NULL;
   }

   nim->nx = nim->ny = nim->nz = nim->nt
           = nim->nu = nim->nv = nim->nw = 1 ;
   nim->dx = nim->dy = nim->dz = nim->dt
           = nim->du = nim->dv = nim->dw = 0 ;
   nim->qfac = 1.0f ;

   nim->byteorder = nifti_short_order() ;

   /* starting at str[spos], scan for "equations" of the form
         lhs = 'rhs'
      and assign rhs values into the struct component named by lhs */

   while(1){

     while( isspace((int) str[spos]) ) spos++ ;  /* skip whitespace */
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* get lhs string */

     ii = sscanf( str+spos , "%1023s%n" , lhs , &nn ) ; spos += nn ;
     if( ii == 0 || strcmp(lhs,"/>") == 0 ) break ;  /* end of input? */

     /* skip whitespace and the '=' marker */

     while( isspace((int) str[spos]) || str[spos] == '=' ) spos++ ;
     if( str[spos] == '\0' ) break ;       /* end of string? */

     /* if next character is a quote ', copy everything up to next '
        otherwise, copy everything up to next nonblank              */

     if( str[spos] == '\'' ){
        ii = spos+1 ;
        while( str[ii] != '\0' && str[ii] != '\'' ) ii++ ;
        nn = ii-spos-1 ; if( nn > 1023 ) nn = 1023 ;
        memcpy(rhs,str+spos+1,nn) ; rhs[nn] = '\0' ;
        spos = (str[ii] == '\'') ? ii+1 : ii ;
     } else {
        ii = sscanf( str+spos , "%1023s%n" , rhs , &nn ) ; spos += nn ;
        if( ii == 0 ) break ;  /* nothing found? */
     }
     unescape_string(rhs) ;  /* remove any XML escape sequences */

     /* Now can do the assignment, based on lhs string.
        Start with special cases that don't fit the QNUM/QSTR macros. */

     if( strcmp(lhs,"nifti_type") == 0 ){
            if( strcmp(rhs,"ANALYZE-7.5") == 0 )
               nim->nifti_type = NIFTI_FTYPE_ANALYZE ;
       else if( strcmp(rhs,"NIFTI-1+")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_1 ;
       else if( strcmp(rhs,"NIFTI-1")     == 0 )
               nim->nifti_type = NIFTI_FTYPE_NIFTI1_2 ;
       else if( strcmp(rhs,"NIFTI-1A")    == 0 )
               nim->nifti_type = NIFTI_FTYPE_ASCII ;
     }
     else if( strcmp(lhs,"header_filename") == 0 ){
       nim->fname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"image_filename") == 0 ){
       nim->iname = nifti_strdup(rhs) ;
     }
     else if( strcmp(lhs,"sto_xyz_matrix") == 0 ){
       sscanf( rhs , "%f %f %f %f %f %f %f %f %f %f %f %f %f %f %f %f" ,
               &(nim->sto_xyz.m[0][0]) , &(nim->sto_xyz.m[0][1]) ,
               &(nim->sto_xyz.m[0][2]) , &(nim->sto_xyz.m[0][3]) ,
               &(nim->sto_xyz.m[1][0]) , &(nim->sto_xyz.m[1][1]) ,
               &(nim->sto_xyz.m[1][2]) , &(nim->sto_xyz.m[1][3]) ,
               &(nim->sto_xyz.m[2][0]) , &(nim->sto_xyz.m[2][1]) ,
               &(nim->sto_xyz.m[2][2]) , &(nim->sto_xyz.m[2][3]) ,
               &(nim->sto_xyz.m[3][0]) , &(nim->sto_xyz.m[3][1]) ,
               &(nim->sto_xyz.m[3][2]) , &(nim->sto_xyz.m[3][3])  ) ;
     }
     else if( strcmp(lhs,"byteorder") == 0 ){
       if( strcmp(rhs,"MSB_FIRST") == 0 ) nim->byteorder = MSB_FIRST ;
       if( strcmp(rhs,"LSB_FIRST") == 0 ) nim->byteorder = LSB_FIRST ;
     }
     else QQNUM(image_offset,iname_offset,int) ;
     else QNUM(datatype,short int) ;
     else QNUM(ndim,int) ;
     else QNUM(nx,int) ;
     else QNUM(ny,int) ;
     else QNUM(nz,int) ;
     else QNUM(nt,int) ;
     else QNUM(nu,int) ;
     else QNUM(nv,int) ;
     else QNUM(nw,int) ;
     else QNUM(dx,float) ;
     else QNUM(dy,float) ;
     else QNUM(dz,float) ;
     else QNUM(dt,float) ;
     else QNUM(du,float) ;
     else QNUM(dv,float) ;
     else QNUM(dw,float) ;
     else QNUM(cal_min,float) ;
     else QNUM(cal_max,float) ;
     else QNUM(scl_slope,float) ;
     else QNUM(scl_inter,float) ;
     else QNUM(intent_code,short) ;
     else QNUM(intent_p1,float) ;
     else QNUM(intent_p2,float) ;
     else QNUM(intent_p3,float) ;
     else QSTR(intent_name,15) ;
     else QNUM(toffset,float) ;
     else QNUM(xyz_units,int) ;
     else QNUM(time_units,int) ;
     else QSTR(descrip,79) ;
     else QSTR(aux_file,23) ;
     else QNUM(qform_code,int) ;
     else QNUM(quatern_b,float) ;
     else QNUM(quatern_c,float) ;
     else QNUM(quatern_d,float) ;
     else QNUM(qoffset_x,float) ;
     else QNUM(qoffset_y,float) ;
     else QNUM(qoffset_z,float) ;
     else QNUM(qfac,float) ;
     else QNUM(sform_code,int) ;
     else QNUM(freq_dim,int) ;
     else QNUM(phase_dim,int) ;
     else QNUM(slice_dim,int) ;
     else QNUM(slice_code,int) ;
     else QNUM(slice_start,int) ;
     else QNUM(slice_end,int) ;
     else QNUM(slice_duration,float) ;
     else QNUM(num_ext,int) ;

   } /* end of while loop */

   if( bytes_read ) *bytes_read = spos+1;         /* "process" last '\n' */

   /* do miscellaneous checking and cleanup */

   if( nim->ndim <= 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nifti_datatype_sizes( nim->datatype, &(nim->nbyper), &(nim->swapsize) );
   if( nim->nbyper == 0 ){ nifti_image_free(nim); return NULL; } /* bad! */

   nim->dim[0] = nim->ndim ;
   nim->dim[1] = nim->nx ; nim->pixdim[1] = nim->dx ;
   nim->dim[2] = nim->ny ; nim->pixdim[2] = nim->dy ;
   nim->dim[3] = nim->nz ; nim->pixdim[3] = nim->dz ;
   nim->dim[4] = nim->nt ; nim->pixdim[4] = nim->dt ;
   nim->dim[5] = nim->nu ; nim->pixdim[5] = nim->du ;
   nim->dim[6] = nim->nv ; nim->pixdim[6] = nim->dv ;
   nim->dim[7] = nim->nw ; nim->pixdim[7] = nim->dw ;

   nim->nvox = (size_t)nim->nx * nim->ny * nim->nz
                     * nim->nt * nim->nu * nim->nv * nim->nw ;

   if( nim->qform_code > 0 )
     nim->qto_xyz = nifti_quatern_to_mat44(
                      nim->quatern_b, nim->quatern_c, nim->quatern_d,
                      nim->qoffset_x, nim->qoffset_y, nim->qoffset_z,
                      nim->dx       , nim->dy       , nim->dz       ,
                      nim->qfac                                      ) ;
   else
     nim->qto_xyz = nifti_quatern_to_mat44(
                      0.0f , 0.0f , 0.0f , 0.0f , 0.0f , 0.0f ,
                      nim->dx , nim->dy , nim->dz , 0.0f ) ;


   nim->qto_ijk = nifti_mat44_inverse( nim->qto_xyz ) ;

   if( nim->sform_code > 0 )
     nim->sto_ijk = nifti_mat44_inverse( nim->sto_xyz ) ;

   return nim ;
}